

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  cmCTestBuildHandler *pcVar5;
  cmValue cVar6;
  cmValue __rhs;
  string *native;
  string *target;
  cmake *gname;
  _Alloc_hider _Var7;
  ostream *poVar8;
  string cmakeBuildConfiguration;
  string dir;
  string buildCommand;
  string e;
  char *local_50 [4];
  
  pcVar5 = cmCTest::GetBuildHandler((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(pcVar5->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(pcVar5);
  this->Handler = pcVar5;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CTEST_BUILD_COMMAND",(allocator<char> *)&cmakeBuildConfiguration);
  cVar6 = cmMakefile::GetDefinition(pcVar1,&e);
  std::__cxx11::string::~string((string *)&e);
  if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
               cVar6.Value,(this->super_cmCTestHandlerCommand).Quiet);
    goto LAB_001fc20d;
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CTEST_CMAKE_GENERATOR",(allocator<char> *)&cmakeBuildConfiguration);
  __rhs = cmMakefile::GetDefinition(pcVar1,&e);
  std::__cxx11::string::~string((string *)&e);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CTEST_BUILD_CONFIGURATION",(allocator<char> *)&cmakeBuildConfiguration);
  cVar6 = cmMakefile::GetDefinition(pcVar1,&e);
  std::__cxx11::string::~string((string *)&e);
  if ((this->Configuration)._M_string_length == 0) {
    if ((cVar6.Value == (string *)0x0) || ((cVar6.Value)->_M_string_length == 0)) {
      cVar6.Value = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    }
  }
  else {
    cVar6.Value = &this->Configuration;
  }
  std::__cxx11::string::string((string *)&cmakeBuildConfiguration,(string *)cVar6.Value);
  if ((this->Flags)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CTEST_BUILD_FLAGS",(allocator<char> *)&dir);
    native = cmMakefile::GetSafeDefinition(pcVar1,&e);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    native = &this->Flags;
  }
  if ((this->Target)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CTEST_BUILD_TARGET",(allocator<char> *)&dir);
    target = cmMakefile::GetSafeDefinition(pcVar1,&e);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    target = &this->Target;
  }
  if ((__rhs.Value == (string *)0x0) || ((__rhs.Value)->_M_string_length == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,
                    "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                   );
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,&dir);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    goto LAB_001fc30a;
  }
  if (cmakeBuildConfiguration._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&cmakeBuildConfiguration);
  }
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  if (pcVar2 == (cmGlobalGenerator *)0x0) {
LAB_001fc066:
    gname = cmMakefile::GetCMakeInstance
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                       Makefile);
    cmake::CreateGlobalGenerator((cmake *)&e,(string *)gname,SUB81(__rhs.Value,0));
    _Var7 = e._M_dataplus;
    e._M_dataplus._M_p = (pointer)0x0;
    pcVar2 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    (this->GlobalGenerator)._M_t.
    super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)_Var7._M_p
    ;
    if (pcVar2 != (cmGlobalGenerator *)0x0) {
      (*pcVar2->_vptr_cmGlobalGenerator[1])();
      if (e._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)e._M_dataplus._M_p + 8))();
      }
      _Var7._M_p = (pointer)(this->GlobalGenerator)._M_t.
                            super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    }
    if ((cmGlobalGenerator *)_Var7._M_p == (cmGlobalGenerator *)0x0) {
      dir._M_dataplus._M_p._0_1_ = 0x22;
      cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char>
                (&e,(char (*) [35])"could not create generator named \"",__rhs.Value,(char *)&dir);
      cmMakefile::IssueMessage
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile,
                 FATAL_ERROR,&e);
      cmSystemTools::s_FatalErrorOccurred = true;
      std::__cxx11::string::~string((string *)&e);
LAB_001fc30a:
      std::__cxx11::string::~string((string *)&cmakeBuildConfiguration);
      return (cmCTestGenericHandler *)0x0;
    }
  }
  else {
    (*pcVar2->_vptr_cmGlobalGenerator[3])(&e);
    bVar4 = std::operator!=(&e,__rhs.Value);
    std::__cxx11::string::~string((string *)&e);
    if (bVar4) {
      pcVar2 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      (this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
      if (pcVar2 == (cmGlobalGenerator *)0x0) goto LAB_001fc066;
      (*pcVar2->_vptr_cmGlobalGenerator[1])();
    }
    if ((this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0)
    goto LAB_001fc066;
  }
  if (cmakeBuildConfiguration._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&cmakeBuildConfiguration);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"BuildDirectory",(allocator<char> *)&buildCommand);
  cmCTest::GetCTestConfiguration(&dir,pcVar3,&e);
  std::__cxx11::string::~string((string *)&e);
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  bVar4 = cmMakefile::IgnoreErrorsCMP0061
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                     Makefile);
  cmGlobalGenerator::GenerateCMakeBuildCommand
            (&buildCommand,pcVar2,target,&cmakeBuildConfiguration,&this->ParallelLevel,native,bVar4)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar8 = std::operator<<((ostream *)&e,"SetMakeCommand:");
  poVar8 = std::operator<<(poVar8,(string *)&buildCommand);
  std::operator<<(poVar8,"\n");
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
               ,0x70,local_50[0],(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
             &buildCommand,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&buildCommand);
  std::__cxx11::string::~string((string *)&dir);
  std::__cxx11::string::~string((string *)&cmakeBuildConfiguration);
LAB_001fc20d:
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CTEST_USE_LAUNCHERS",(allocator<char> *)&cmakeBuildConfiguration);
  cVar6 = cmMakefile::GetDefinition(pcVar1,&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar6.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
               cVar6.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CTEST_LABELS_FOR_SUBPROJECTS",(allocator<char> *)&cmakeBuildConfiguration
            );
  cVar6 = cmMakefile::GetDefinition(pcVar1,&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar6.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,cVar6.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  (pcVar5->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &pcVar5->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestBuildHandler* handler = this->CTest->GetBuildHandler();
  handler->Initialize();

  this->Handler = handler;

  cmValue ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (cmNonempty(ctestBuildCommand)) {
    this->CTest->SetCTestConfiguration("MakeCommand", *ctestBuildCommand,
                                       this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    cmValue ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    std::string cmakeBuildConfiguration = cmNonempty(this->Configuration)
      ? this->Configuration
      : cmNonempty(ctestBuildConfiguration) ? *ctestBuildConfiguration
                                            : this->CTest->GetConfigType();

    const std::string& cmakeBuildAdditionalFlags = cmNonempty(this->Flags)
      ? this->Flags
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_FLAGS");
    const std::string& cmakeBuildTarget = cmNonempty(this->Target)
      ? this->Target
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_TARGET");

    if (cmNonempty(cmakeGeneratorName)) {
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != *cmakeGeneratorName) {
          this->GlobalGenerator.reset();
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            *cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = cmStrCat("could not create generator named \"",
                                   *cmakeGeneratorName, '"');
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccurred();
          return nullptr;
        }
      }
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Debug";
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget, cmakeBuildConfiguration, this->ParallelLevel,
          cmakeBuildAdditionalFlags, this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand,
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (cmValue useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", *useLaunchers,
                                       this->Quiet);
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}